

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O0

void TrueMotion_SSE2(uint8_t *dst,uint8_t *left,uint8_t *top,int size)

{
  undefined4 in_ECX;
  long in_RDX;
  long in_RSI;
  int in_stack_00000054;
  uint8_t *in_stack_00000058;
  uint8_t *in_stack_00000060;
  uint8_t *in_stack_00000068;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  
  if (in_RSI == 0) {
    if (in_RDX == 0) {
      Fill_SSE2((uint8_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc,
                in_stack_ffffffffffffffd8);
    }
    else {
      VerticalPred_SSE2((uint8_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                        (uint8_t *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
    }
  }
  else if (in_RDX == 0) {
    HorizontalPred_SSE2((uint8_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                        (uint8_t *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
  }
  else {
    TM_SSE2(in_stack_00000068,in_stack_00000060,in_stack_00000058,in_stack_00000054);
  }
  return;
}

Assistant:

static WEBP_INLINE void TrueMotion_SSE2(uint8_t* WEBP_RESTRICT dst,
                                        const uint8_t* WEBP_RESTRICT left,
                                        const uint8_t* WEBP_RESTRICT top,
                                        int size) {
  if (left != NULL) {
    if (top != NULL) {
      TM_SSE2(dst, left, top, size);
    } else {
      HorizontalPred_SSE2(dst, left, size);
    }
  } else {
    // true motion without left samples (hence: with default 129 value)
    // is equivalent to VE prediction where you just copy the top samples.
    // Note that if top samples are not available, the default value is
    // then 129, and not 127 as in the VerticalPred case.
    if (top != NULL) {
      VerticalPred_SSE2(dst, top, size);
    } else {
      Fill_SSE2(dst, 129, size);
    }
  }
}